

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_video.cpp
# Opt level: O0

void __thiscall DCanvas::Dim(DCanvas *this,PalEntry color)

{
  uint32 argb;
  float fVar1;
  anon_union_4_2_12391d7c_for_PalEntry_0 local_3c;
  float local_38;
  float local_34;
  float dim [4];
  float local_20;
  anon_union_4_2_12391d7c_for_PalEntry_0 local_1c;
  float amount;
  PalEntry dimmer;
  DCanvas *this_local;
  PalEntry color_local;
  
  _amount = this;
  PalEntry::PalEntry((PalEntry *)&local_1c.field_0);
  fVar1 = FFloatCVar::operator_cast_to_float(&dimamount);
  if (fVar1 < 0.0) {
    PalEntry::operator=((PalEntry *)&local_1c.field_0,gameinfo.dimcolor);
    local_20 = gameinfo.dimamount;
  }
  else {
    argb = FColorCVar::operator_cast_to_unsigned_int(&dimcolor);
    PalEntry::PalEntry((PalEntry *)(dim + 3),argb);
    local_1c = (anon_union_4_2_12391d7c_for_PalEntry_0)dim[3];
    local_20 = FFloatCVar::operator_cast_to_float(&dimamount);
  }
  if ((gameinfo.gametype == GAME_Hexen) && (gamestate == GS_DEMOSCREEN)) {
    local_20 = MIN<float>(1.0,local_20 * 2.0);
  }
  this_local._7_1_ = color.field_0._3_1_;
  if (this_local._7_1_ != 0) {
    local_38 = (float)((uint)color.field_0 >> 0x10 & 0xff) / 255.0;
    local_34 = (float)((uint)color.field_0 >> 8 & 0xff) / 255.0;
    dim[0] = (float)((uint)color.field_0 & 0xff) / 255.0;
    dim[1] = (float)this_local._7_1_ / 255.0;
    V_AddBlend((float)(local_1c.d >> 0x10 & 0xff) / 255.0,(float)(local_1c.d >> 8 & 0xff) / 255.0,
               (float)(local_1c.d & 0xff) / 255.0,local_20,&local_38);
    PalEntry::PalEntry((PalEntry *)&local_3c.field_0,(BYTE)(int)(local_38 * 255.0),
                       (BYTE)(int)(local_34 * 255.0),(BYTE)(int)(dim[0] * 255.0));
    local_1c = local_3c;
    local_20 = dim[1];
  }
  (*(this->super_DObject)._vptr_DObject[0xe])
            (local_20,this,(ulong)local_1c.d,0,0,(ulong)(uint)this->Width,(ulong)(uint)this->Height)
  ;
  return;
}

Assistant:

void DCanvas::Dim (PalEntry color)
{
	PalEntry dimmer;
	float amount;

	if (dimamount >= 0)
	{
		dimmer = PalEntry(dimcolor);
		amount = dimamount;
	}
	else
	{
		dimmer = gameinfo.dimcolor;
		amount = gameinfo.dimamount;
	}

	if (gameinfo.gametype == GAME_Hexen && gamestate == GS_DEMOSCREEN)
	{ // On the Hexen title screen, the default dimming is not
		// enough to make the menus readable.
		amount = MIN<float> (1.f, amount*2.f);
	}
	// Add the cvar's dimming on top of the color passed to the function
	if (color.a != 0)
	{
		float dim[4] = { color.r/255.f, color.g/255.f, color.b/255.f, color.a/255.f };
		V_AddBlend (dimmer.r/255.f, dimmer.g/255.f, dimmer.b/255.f, amount, dim);
		dimmer = PalEntry (BYTE(dim[0]*255), BYTE(dim[1]*255), BYTE(dim[2]*255));
		amount = dim[3];
	}
	Dim (dimmer, amount, 0, 0, Width, Height);
}